

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAdjacencyTests.cpp
# Opt level: O0

void __thiscall
glcts::GeometryShaderAdjacencyTests::createGridLineStrip
          (GeometryShaderAdjacencyTests *this,AdjacencyTestData *test_data)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  AdjacencyGridPoint *pAVar3;
  AdjacencyGridPoint *pointPtr;
  uint n;
  AdjacencyTestData *test_data_local;
  GeometryShaderAdjacencyTests *this_local;
  
  (test_data->m_grid->m_line_strip).m_n_points = test_data->m_grid->m_n_points + 2;
  auVar1 = ZEXT416((test_data->m_grid->m_line_strip).m_n_points) * ZEXT816(0xc);
  uVar2 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pAVar3 = (AdjacencyGridPoint *)operator_new__(uVar2);
  (test_data->m_grid->m_line_strip).m_points = pAVar3;
  memset((test_data->m_grid->m_line_strip).m_points,0,
         (ulong)(test_data->m_grid->m_line_strip).m_n_points * 0xc);
  for (pointPtr._4_4_ = 0; pointPtr._4_4_ < (test_data->m_grid->m_line_strip).m_n_points;
      pointPtr._4_4_ = pointPtr._4_4_ + 1) {
    pAVar3 = (test_data->m_grid->m_line_strip).m_points + pointPtr._4_4_;
    pAVar3->index = pointPtr._4_4_;
    if (pointPtr._4_4_ == 0) {
      pAVar3->x = test_data->m_grid->m_line_segments->m_point_start_adjacent->x;
      pAVar3->y = test_data->m_grid->m_line_segments->m_point_start_adjacent->y;
    }
    else if (pointPtr._4_4_ == (test_data->m_grid->m_line_strip).m_n_points - 1) {
      pAVar3->x = (test_data->m_grid->m_line_segments[test_data->m_grid->m_n_segments - 1].
                  m_point_end_adjacent)->x;
      pAVar3->y = (test_data->m_grid->m_line_segments[test_data->m_grid->m_n_segments - 1].
                  m_point_end_adjacent)->y;
    }
    else {
      pAVar3->x = (test_data->m_grid->m_line_segments[pointPtr._4_4_ - 1].m_point_start)->x;
      pAVar3->y = (test_data->m_grid->m_line_segments[pointPtr._4_4_ - 1].m_point_start)->y;
    }
  }
  return;
}

Assistant:

void GeometryShaderAdjacencyTests::createGridLineStrip(AdjacencyTestData& test_data)
{
	/* Add 2 extra point for adjacency start+end points */
	test_data.m_grid->m_line_strip.m_n_points = test_data.m_grid->m_n_points + 2;
	test_data.m_grid->m_line_strip.m_points   = new AdjacencyGridPoint[test_data.m_grid->m_line_strip.m_n_points];

	memset(test_data.m_grid->m_line_strip.m_points, 0,
		   sizeof(AdjacencyGridPoint) * test_data.m_grid->m_line_strip.m_n_points);

	for (unsigned int n = 0; n < test_data.m_grid->m_line_strip.m_n_points; ++n)
	{
		AdjacencyGridPoint* pointPtr = test_data.m_grid->m_line_strip.m_points + n;

		pointPtr->index = n;

		/* If this is a start point, use any of the adjacent points */
		if (n == 0)
		{
			pointPtr->x = test_data.m_grid->m_line_segments[0].m_point_start_adjacent->x;
			pointPtr->y = test_data.m_grid->m_line_segments[0].m_point_start_adjacent->y;
		}
		else
			/* Last point should be handled analogously */
			if (n == (test_data.m_grid->m_line_strip.m_n_points - 1))
		{
			pointPtr->x = test_data.m_grid->m_line_segments[test_data.m_grid->m_n_segments - 1].m_point_end_adjacent->x;
			pointPtr->y = test_data.m_grid->m_line_segments[test_data.m_grid->m_n_segments - 1].m_point_end_adjacent->y;
		}
		else
		/* Intermediate points */
		{
			pointPtr->x = test_data.m_grid->m_line_segments[n - 1].m_point_start->x;
			pointPtr->y = test_data.m_grid->m_line_segments[n - 1].m_point_start->y;
		}
	} /* for (all points) */
}